

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdVerifyTxSign(void *handle,int net_type,char *tx_hex,char *txid,uint32_t vout,char *address,
                   int address_type,char *direct_locking_script,int64_t value_satoshi,
                   char *value_bytedata)

{
  bool bVar1;
  AddressType AVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  CfdException *pCVar4;
  initializer_list<cfd::UtxoData> __l;
  bool is_bitcoin;
  ElementsAddressFactory address_factory_1;
  OutPoint outpoint;
  Amount amount;
  AddressFactory address_factory;
  ElementsConfidentialAddress confidential_addr;
  UtxoData utxo;
  bool local_c12;
  allocator local_c11;
  void *local_c10;
  string local_c08;
  undefined1 local_be8 [40];
  OutPoint local_bc0;
  Amount local_b98;
  undefined1 local_b88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b78;
  undefined1 local_b68 [16];
  pointer local_b58;
  pointer local_b40;
  pointer local_b28;
  TapBranch local_b10;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a98;
  Script local_a80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a40;
  undefined1 local_a10 [32];
  undefined1 local_9f0 [16];
  pointer local_9e0;
  pointer local_9c8;
  pointer local_9b0;
  TapBranch local_998;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_920;
  Script local_908;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_8c8 [19];
  UtxoData local_520;
  
  local_c10 = handle;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex);
  if (bVar1) {
    local_520.block_height = 0x5e44da;
    local_520.block_hash._vptr_BlockHash._0_4_ = 0x8a8;
    local_520.block_hash.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdVerifyTxSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_520,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_520.block_height = (uint64_t)&local_520.block_hash.data_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_520,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_520);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    local_520.block_height = 0x5e44da;
    local_520.block_hash._vptr_BlockHash._0_4_ = 0x8ae;
    local_520.block_hash.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "CfdVerifyTxSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_520,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_520.block_height = (uint64_t)&local_520.block_hash.data_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_520,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&local_520);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  AVar2 = cfd::capi::ConvertAddressType(0);
  cfd::core::Amount::Amount(&local_b98,value_satoshi);
  std::__cxx11::string::string((string *)local_a10,txid,(allocator *)local_b88);
  cfd::core::Txid::Txid((Txid *)&local_520,(string *)local_a10);
  cfd::core::OutPoint::OutPoint(&local_bc0,(Txid *)&local_520,vout);
  local_520.block_height = (uint64_t)&PTR__Txid_00723450;
  if ((void *)CONCAT44(local_520.block_hash._vptr_BlockHash._4_4_,
                       local_520.block_hash._vptr_BlockHash._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_520.block_hash._vptr_BlockHash._4_4_,
                                     local_520.block_hash._vptr_BlockHash._0_4_));
  }
  if ((undefined1 *)local_a10._0_8_ != local_a10 + 0x10) {
    operator_delete((void *)local_a10._0_8_);
  }
  local_c12 = false;
  cfd::capi::ConvertNetType(net_type,&local_c12);
  cfd::UtxoData::UtxoData(&local_520);
  local_520.address_type = kP2shAddress;
  local_520.block_height = 0;
  local_520.binary_data = (void *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&local_520.descriptor,0,(char *)local_520.descriptor._M_string_length,0x6169ca);
  cfd::core::OutPoint::GetTxid((Txid *)local_a10,&local_bc0);
  cfd::core::Txid::operator=(&local_520.txid,(Txid *)local_a10);
  local_a10._0_8_ = &PTR__Txid_00723450;
  if ((_func_int **)local_a10._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_a10._8_8_);
  }
  local_520.vout = cfd::core::OutPoint::GetVout(&local_bc0);
  local_520.amount.amount_ = local_b98.amount_;
  local_520.amount.ignore_check_ = local_b98.ignore_check_;
  local_520.address_type = AVar2;
  bVar1 = cfd::capi::IsEmptyString(address);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(direct_locking_script);
    if (bVar1) goto LAB_0042e6e8;
    std::__cxx11::string::string((string *)local_b88,direct_locking_script,(allocator *)local_be8);
    cfd::core::Script::Script((Script *)local_a10,(string *)local_b88);
    cfd::core::Script::operator=(&local_520.locking_script,(Script *)local_a10);
    cfd::core::Script::~Script((Script *)local_a10);
    paVar3 = &local_b78;
  }
  else {
    std::__cxx11::string::string((string *)&local_c08,address,(allocator *)local_a10);
    if (local_c12 == true) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_b88);
      cfd::AddressFactory::GetAddress((Address *)local_a10,(AddressFactory *)local_b88,&local_c08);
      cfd::core::Address::operator=(&local_520.address,(Address *)local_a10);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(local_8c8);
      cfd::core::Script::~Script(&local_908);
      local_998._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_920);
      cfd::core::TapBranch::~TapBranch(&local_998);
      if (local_9b0 != (pointer)0x0) {
        operator_delete(local_9b0);
      }
      if (local_9c8 != (pointer)0x0) {
        operator_delete(local_9c8);
      }
      if (local_9e0 != (pointer)0x0) {
        operator_delete(local_9e0);
      }
      if ((undefined1 *)local_a10._16_8_ != local_9f0) {
        operator_delete((void *)local_a10._16_8_);
      }
      paVar3 = &local_b78;
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)local_be8);
      bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_c08);
      if (bVar1) {
        cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)local_a10,&local_c08);
        cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
                  ((Address *)local_b88,(ElementsConfidentialAddress *)local_a10);
        cfd::core::Address::operator=(&local_520.address,(Address *)local_b88);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_a40);
        cfd::core::Script::~Script(&local_a80);
        local_b10._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_a98);
        cfd::core::TapBranch::~TapBranch(&local_b10);
        if (local_b28 != (pointer)0x0) {
          operator_delete(local_b28);
        }
        if (local_b40 != (pointer)0x0) {
          operator_delete(local_b40);
        }
        if (local_b58 != (pointer)0x0) {
          operator_delete(local_b58);
        }
        if ((undefined1 *)local_b78._M_allocated_capacity != local_b68) {
          operator_delete((void *)local_b78._M_allocated_capacity);
        }
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)local_a10);
      }
      else {
        cfd::AddressFactory::GetAddress((Address *)local_a10,(AddressFactory *)local_be8,&local_c08)
        ;
        cfd::core::Address::operator=(&local_520.address,(Address *)local_a10);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_8c8);
        cfd::core::Script::~Script(&local_908);
        local_998._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_920);
        cfd::core::TapBranch::~TapBranch(&local_998);
        if (local_9b0 != (pointer)0x0) {
          operator_delete(local_9b0);
        }
        if (local_9c8 != (pointer)0x0) {
          operator_delete(local_9c8);
        }
        if (local_9e0 != (pointer)0x0) {
          operator_delete(local_9e0);
        }
        if ((undefined1 *)local_a10._16_8_ != local_9f0) {
          operator_delete((void *)local_a10._16_8_);
        }
      }
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_be8 + 0x10);
    }
    paVar3[-1]._M_allocated_capacity = (size_type)&PTR__AddressFactory_007215c8;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            paVar3);
    cfd::core::Address::GetLockingScript((Script *)local_a10,&local_520.address);
    cfd::core::Script::operator=(&local_520.locking_script,(Script *)local_a10);
    cfd::core::Script::~Script((Script *)local_a10);
    paVar3 = &local_c08.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar3->_M_allocated_capacity)[-2] != paVar3) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar3->_M_allocated_capacity)[-2]);
  }
LAB_0042e6e8:
  cfd::UtxoData::UtxoData((UtxoData *)local_a10,&local_520);
  __l._M_len = 1;
  __l._M_array = (iterator)local_a10;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)&local_c08,__l,
             (allocator_type *)local_b88);
  cfd::UtxoData::~UtxoData((UtxoData *)local_a10);
  if (local_c12 == true) {
    std::__cxx11::string::string((string *)local_b88,tx_hex,(allocator *)local_be8);
    cfd::TransactionContext::TransactionContext((TransactionContext *)local_a10,(string *)local_b88)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b88._0_8_ != &local_b78) {
      operator_delete((void *)local_b88._0_8_);
    }
    cfd::TransactionContext::GetTxInIndex((TransactionContext *)local_a10,&local_bc0);
    cfd::TransactionContext::CollectInputUtxo
              ((TransactionContext *)local_a10,
               (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)&local_c08);
    cfd::TransactionContext::Verify((TransactionContext *)local_a10,&local_bc0);
    cfd::TransactionContext::~TransactionContext((TransactionContext *)local_a10);
  }
  else {
    std::__cxx11::string::string((string *)local_b88,tx_hex,(allocator *)local_be8);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)local_a10,(string *)local_b88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b88._0_8_ != &local_b78) {
      operator_delete((void *)local_b88._0_8_);
    }
    bVar1 = cfd::capi::IsEmptyString(value_bytedata);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_be8,value_bytedata,&local_c11);
      cfd::core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)local_b88,(string *)local_be8);
      cfd::core::ConfidentialValue::operator=
                (&local_520.value_commitment,(ConfidentialValue *)local_b88);
      local_b88._0_8_ = &PTR__ConfidentialValue_00723840;
      if ((pointer)local_b88._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_b88._8_8_);
      }
      if ((undefined1 *)local_be8._0_8_ != local_be8 + 0x10) {
        operator_delete((void *)local_be8._0_8_);
      }
      cfd::UtxoData::operator=((UtxoData *)local_c08._M_dataplus._M_p,&local_520);
    }
    cfd::ConfidentialTransactionContext::GetTxInIndex
              ((ConfidentialTransactionContext *)local_a10,&local_bc0);
    cfd::ConfidentialTransactionContext::CollectInputUtxo
              ((ConfidentialTransactionContext *)local_a10,
               (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)&local_c08);
    cfd::ConfidentialTransactionContext::Verify
              ((ConfidentialTransactionContext *)local_a10,&local_bc0);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)local_a10);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)&local_c08);
  cfd::UtxoData::~UtxoData(&local_520);
  local_bc0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (local_bc0.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bc0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdVerifyTxSign(
    void* handle, int net_type, const char* tx_hex, const char* txid,
    uint32_t vout, const char* address, int address_type,
    const char* direct_locking_script, int64_t value_satoshi,
    const char* value_bytedata) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    AddressType addr_type = ConvertAddressType(address_type);
    Amount amount = Amount(value_satoshi);
    OutPoint outpoint(Txid(txid), vout);

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);

    UtxoData utxo;
    utxo.address_type = AddressType::kP2shAddress;
    utxo.block_height = 0;
    utxo.binary_data = nullptr;
    utxo.descriptor = "";
    utxo.txid = outpoint.GetTxid();
    utxo.vout = outpoint.GetVout();
    utxo.address_type = addr_type;
    utxo.amount = amount;
    if (!IsEmptyString(address)) {
      std::string addr(address);
      if (is_bitcoin) {
        AddressFactory address_factory;
        utxo.address = address_factory.GetAddress(addr);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ElementsAddressFactory address_factory;
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
          ElementsConfidentialAddress confidential_addr(addr);
          utxo.address = confidential_addr.GetUnblindedAddress();
        } else {
          utxo.address = address_factory.GetAddress(addr);
        }
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
      utxo.locking_script = utxo.address.GetLockingScript();
    } else if (!IsEmptyString(direct_locking_script)) {
      utxo.locking_script = Script(direct_locking_script);
    }
    std::vector<UtxoData> utxos = {utxo};

    if (is_bitcoin) {
      TransactionContext tx(tx_hex);
      tx.GetTxInIndex(outpoint);
      tx.CollectInputUtxo(utxos);
      result = CfdErrorCode::kCfdSignVerificationError;
      tx.Verify(outpoint);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex);
      if (!IsEmptyString(value_bytedata)) {
        utxo.value_commitment = ConfidentialValue(value_bytedata);
        utxos[0] = utxo;
      }
      tx.GetTxInIndex(outpoint);
      tx.CollectInputUtxo(utxos);
      result = CfdErrorCode::kCfdSignVerificationError;
      tx.Verify(outpoint);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    if (result != CfdErrorCode::kCfdSignVerificationError) {
      result = SetLastError(handle, except);
    } else {
      SetLastError(handle, except);  // collect error message
    }
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}